

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  uint *puVar1;
  ReflectionSchema *this_00;
  byte bVar2;
  Descriptor *pDVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined8 *puVar7;
  ulong extraout_RAX;
  ulong uVar8;
  OneofDescriptor *pOVar9;
  char *description;
  Metadata MVar10;
  
  MVar10 = Message::GetMetadata(message);
  if (MVar10.reflection != this) goto LAB_00f63d07;
  pDVar3 = this->descriptor_;
  if (field->containing_type_ != pDVar3) {
    description = "Field does not match message type.";
LAB_00f63d46:
    anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"SetAllocatedMessage",description);
  }
  bVar2 = field->field_0x1;
  if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
    if ((bVar2 & 0x20) != 0) {
      description = "Field is repeated; the method requires a singular field.";
      goto LAB_00f63d46;
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
      anon_unknown_6::ReportReflectionUsageTypeError
                (pDVar3,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
    }
    this_00 = &this->schema_;
    if ((bVar2 & 8) != 0) {
      uVar5 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(this_00);
      protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                 field->number_,field->type_,field,&sub_message->super_MessageLite);
      return;
    }
    bVar4 = protobuf::internal::ReflectionSchema::InRealOneof(this_00,field);
    if (bVar4) {
      if (sub_message == (Message *)0x0) {
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar9 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar9 = (field->scope_).containing_oneof;
          if (pOVar9 == (OneofDescriptor *)0x0) goto LAB_00f63d62;
        }
        ClearOneof(this,message,pOVar9);
        return;
      }
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar9 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar9 = (field->scope_).containing_oneof;
        if (pOVar9 == (OneofDescriptor *)0x0) goto LAB_00f63d62;
      }
      ClearOneof(this,message,pOVar9);
      VerifyFieldType<google::protobuf::Message*>(this,field);
      puVar7 = (undefined8 *)MutableRawImpl(this,message,field);
      *puVar7 = sub_message;
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar9 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar9 = (field->scope_).containing_oneof;
        if (pOVar9 == (OneofDescriptor *)0x0) {
LAB_00f63d62:
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
      }
      if ((pOVar9->field_count_ != 1) || ((pOVar9->fields_->field_0x1 & 2) == 0)) {
        *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar9 -
                                           (long)pOVar9->containing_type_->oneof_decls_) >> 3) *
                              -0x24924924 + (this->schema_).oneof_case_offset_)) = field->number_;
        return;
      }
      UnsafeArenaSetAllocatedMessage();
LAB_00f63cf3:
      UnsafeArenaSetAllocatedMessage();
LAB_00f63cfd:
      UnsafeArenaSetAllocatedMessage();
LAB_00f63d07:
      pDVar3 = this->descriptor_;
      MVar10 = Message::GetMetadata(message);
      anon_unknown_6::ReportReflectionUsageMessageError
                (pDVar3,MVar10.descriptor,field,"SetAllocatedMessage");
    }
    if (sub_message == (Message *)0x0) {
      if ((field->options_->field_0)._impl_.weak_ == true) goto LAB_00f63cf3;
      uVar5 = protobuf::internal::ReflectionSchema::HasBitIndex(this_00,field);
      if (uVar5 != 0xffffffff) {
        if ((this->schema_).has_bits_offset_ == -1) goto LAB_00f63cfd;
        bVar2 = (byte)uVar5 & 0x1f;
        uVar6 = protobuf::internal::ReflectionSchema::HasBitsOffset(this_00);
        puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uVar5 >> 5) * 4 + (ulong)uVar6);
        *puVar1 = *puVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
      }
    }
    else {
      SetHasBit(this,message,field);
    }
    VerifyFieldType<google::protobuf::Message*>(this,field);
    field = (FieldDescriptor *)MutableRawImpl(this,message,field);
    uVar8 = (message->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar8 & 1) == 0) goto LAB_00f63c01;
  }
  else {
    UnsafeArenaSetAllocatedMessage();
    uVar8 = extraout_RAX;
  }
  uVar8 = *(ulong *)(uVar8 & 0xfffffffffffffffe);
LAB_00f63c01:
  if ((uVar8 == 0) && (*(long **)field != (long *)0x0)) {
    (**(code **)(**(long **)field + 8))();
  }
  *(Message **)field = sub_message;
  return;
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);


  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (schema_.InRealOneof(field)) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearHasBit(message, field);
    } else {
      SetHasBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (message->GetArena() == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}